

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_usingCDict_internal
                 (ZSTD_CCtx *cctx,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  ulong in_R8;
  U32 limitedSrcLog;
  U32 limitedSrcSize;
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  ZSTD_CDict *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe74;
  ulong local_188;
  undefined4 local_170;
  int in_stack_fffffffffffffe94;
  ZSTD_parameters *in_stack_fffffffffffffe98;
  ZSTD_CCtx_params *in_stack_fffffffffffffea0;
  undefined4 local_158;
  ZSTD_CDict *local_154;
  undefined8 local_14c;
  ZSTD_CCtx_params *local_144;
  undefined4 local_13c;
  ZSTD_dictTableLoadMethod_e dtlm;
  ZSTD_dictContentType_e dictContentType;
  undefined4 uVar1;
  undefined4 uVar2;
  ZSTD_CCtx_params *in_stack_ffffffffffffff10;
  U64 in_stack_ffffffffffffff18;
  ZSTD_buffered_policy_e in_stack_ffffffffffffff20;
  size_t local_8;
  
  if (in_RSI == 0) {
    local_8 = 0xffffffffffffffe0;
  }
  else {
    uVar1 = (undefined4)in_RDX;
    uVar2 = (undefined4)((ulong)in_RDX >> 0x20);
    if ((((in_R8 < 0x20000) || (in_R8 < (ulong)(*(long *)(in_RSI + 8) * 6))) ||
        (in_R8 == 0xffffffffffffffff)) || (*(int *)(in_RSI + 0x17b4) == 0)) {
      ZSTD_getCParamsFromCDict(in_stack_fffffffffffffe60);
      dictContentType = (ZSTD_dictContentType_e)((ulong)local_14c >> 0x20);
      dtlm = (ZSTD_dictTableLoadMethod_e)local_14c;
    }
    else {
      ZSTD_getCParams(in_stack_fffffffffffffe74,
                      CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                      (size_t)in_stack_fffffffffffffe60);
      local_154 = (ZSTD_CDict *)CONCAT44(in_stack_fffffffffffffe94,local_170);
      dictContentType = (ZSTD_dictContentType_e)((ulong)in_stack_fffffffffffffe98 >> 0x20);
      dtlm = (ZSTD_dictTableLoadMethod_e)in_stack_fffffffffffffe98;
      local_144 = in_stack_fffffffffffffea0;
      local_13c = local_158;
    }
    ZSTD_CCtxParams_init_internal
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94);
    if (in_R8 != 0xffffffffffffffff) {
      local_188 = in_R8;
      if (0x7ffff < in_R8) {
        local_188 = 0x80000;
      }
      if (1 < (uint)local_188) {
        ZSTD_highbit32(0);
      }
    }
    local_8 = ZSTD_compressBegin_internal
                        ((ZSTD_CCtx *)CONCAT44(in_ECX,uVar2),(void *)CONCAT44(uVar1,local_13c),
                         (size_t)local_144,dictContentType,dtlm,local_154,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  }
  return local_8;
}

Assistant:

static size_t ZSTD_compressBegin_usingCDict_internal(
    ZSTD_CCtx* const cctx, const ZSTD_CDict* const cdict,
    ZSTD_frameParameters const fParams, unsigned long long const pledgedSrcSize)
{
    ZSTD_CCtx_params cctxParams;
    DEBUGLOG(4, "ZSTD_compressBegin_usingCDict_internal");
    RETURN_ERROR_IF(cdict==NULL, dictionary_wrong, "NULL pointer!");
    /* Initialize the cctxParams from the cdict */
    {
        ZSTD_parameters params;
        params.fParams = fParams;
        params.cParams = ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
                        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
                        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
                        || cdict->compressionLevel == 0 ) ?
                ZSTD_getCParamsFromCDict(cdict)
              : ZSTD_getCParams(cdict->compressionLevel,
                                pledgedSrcSize,
                                cdict->dictContentSize);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, cdict->compressionLevel);
    }
    /* Increase window log to fit the entire dictionary and source if the
     * source size is known. Limit the increase to 19, which is the
     * window log for compression level 1 with the largest source size.
     */
    if (pledgedSrcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const limitedSrcSize = (U32)MIN(pledgedSrcSize, 1U << 19);
        U32 const limitedSrcLog = limitedSrcSize > 1 ? ZSTD_highbit32(limitedSrcSize - 1) + 1 : 1;
        cctxParams.cParams.windowLog = MAX(cctxParams.cParams.windowLog, limitedSrcLog);
    }
    return ZSTD_compressBegin_internal(cctx,
                                        NULL, 0, ZSTD_dct_auto, ZSTD_dtlm_fast,
                                        cdict,
                                        &cctxParams, pledgedSrcSize,
                                        ZSTDb_not_buffered);
}